

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int emit_goto(JSParseState *s,int opcode,int label)

{
  LabelSlot *pLVar1;
  BOOL BVar2;
  int local_1c;
  
  BVar2 = js_is_live_code(s);
  if (BVar2 == 0) {
    label = -1;
  }
  else {
    if (label < 0) {
      label = new_label_fd(s->cur_func,-1);
    }
    emit_op(s,(uint8_t)opcode);
    local_1c = label;
    dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_1c,4);
    pLVar1 = s->cur_func->label_slots + label;
    pLVar1->ref_count = pLVar1->ref_count + 1;
  }
  return label;
}

Assistant:

static int emit_goto(JSParseState *s, int opcode, int label)
{
    if (js_is_live_code(s)) {
        if (label < 0)
            label = new_label(s);
        emit_op(s, opcode);
        emit_u32(s, label);
        s->cur_func->label_slots[label].ref_count++;
        return label;
    }
    return -1;
}